

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

_Bool CrawlSpaces(Lexer *lexer)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  _Bool _Var5;
  long lVar6;
  char character;
  int iVar7;
  
  iVar2 = lexer->length;
  iVar3 = (lexer->tracker).currentTokenPosition;
  if (iVar3 < iVar2) {
    pcVar4 = lexer->rawSourceCode;
    if (pcVar4[iVar3] == ' ') {
      lVar6 = (long)iVar3 + 1;
      iVar7 = (int)lVar6;
      (lexer->tracker).currentTokenPosition = iVar7;
      character = -1;
      if (iVar7 < iVar2) {
        character = pcVar4[lVar6];
      }
      (lexer->tracker).currentTokenPosition = iVar3;
      _Var5 = IsCharacter(character," \n\r");
      if (_Var5) {
        iVar7 = iVar3 + 1;
        do {
          if (character == '\n') {
            piVar1 = &(lexer->tracker).row;
            *piVar1 = *piVar1 + 1;
            (lexer->tracker).col = 1;
          }
          (lexer->tracker).currentTokenPosition = iVar7;
          character = -1;
          if (lVar6 < iVar2) {
            character = pcVar4[lVar6];
          }
          _Var5 = IsCharacter(character," \n\r");
          lVar6 = lVar6 + 1;
          iVar7 = iVar7 + 1;
        } while (_Var5);
      }
      (lexer->tracker).currentTokenPosition = iVar7;
      return true;
    }
  }
  return false;
}

Assistant:

bool CrawlSpaces(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	if (currentChar == ' '){
		char nextChar = PeekNextCharacter(lexer);
		char* checkCharacters = " \n\r";
		while (IsCharacter(nextChar, checkCharacters)){
			if (nextChar == '\n'){
				lexer->tracker.row++;
				lexer->tracker.col = 1;
			}

			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
		}
		GetNextCharacter(lexer);
		return true;
	}
	return false;
}